

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool __thiscall FIX::Session::nextQueued(Session *this,SEQNUM num,UtcTimeStamp *now)

{
  SessionState *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  FieldBase *pFVar4;
  size_type *psVar5;
  unsigned_long value;
  Message msg;
  string local_1c0;
  string local_1a0;
  Message local_180;
  
  Message::Message(&local_180);
  this_00 = &this->m_state;
  bVar1 = SessionState::retrieve(this_00,num,&local_180);
  if (bVar1) {
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_1a0,(IntTConvertor<unsigned_long> *)num,value);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1cdfdb);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1c0.field_2._M_allocated_capacity = *psVar5;
      local_1c0.field_2._8_8_ = plVar3[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *psVar5;
      local_1c0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1c0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    SessionState::onEvent(this_00,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    pFVar4 = FieldMap::getFieldRef(&local_180.m_header.super_FieldMap,0x23);
    iVar2 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
      if (iVar2 != 0) {
        next(this,&local_180,now,true);
        goto LAB_001ab884;
      }
    }
    SessionState::incrNextTargetMsgSeqNum(this_00);
  }
LAB_001ab884:
  Message::~Message(&local_180);
  return bVar1;
}

Assistant:

bool Session::nextQueued(SEQNUM num, const UtcTimeStamp &now) {
  Message msg;

  if (m_state.retrieve(num, msg)) {
    m_state.onEvent("Processing QUEUED message: " + SEQNUM_CONVERTOR::convert(num));
    auto const &msgType = msg.getHeader().getField<MsgType>();
    if (msgType == MsgType_Logon || msgType == MsgType_ResendRequest) {
      m_state.incrNextTargetMsgSeqNum();
    } else {
      next(msg, now, true);
    }
    return true;
  }
  return false;
}